

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regspace.c
# Opt level: O1

int nva_rd(nva_regspace *regspace,uint32_t addr,uint64_t *val)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  nva_card **ppnVar8;
  byte bVar9;
  ushort uVar10;
  int iVar11;
  void **ppvVar12;
  ulong uVar13;
  void *pvVar14;
  uint uVar15;
  size_t sVar16;
  long lVar17;
  pci_io_handle *ppVar18;
  uint64_t uVar19;
  int iVar20;
  undefined1 uVar21;
  
  ppnVar8 = nva_cards;
  switch(regspace->type) {
  case NVA_REGSPACE_BAR0:
    sVar16 = regspace->card->bar0len;
    ppvVar12 = &regspace->card->bar0;
    goto LAB_00103ccb;
  case NVA_REGSPACE_BAR1:
    sVar16 = regspace->card->bar1len;
    ppvVar12 = &regspace->card->bar1;
    goto LAB_00103ccb;
  case NVA_REGSPACE_BAR2:
    sVar16 = regspace->card->bar2len;
    ppvVar12 = &regspace->card->bar2;
    goto LAB_00103ccb;
  case NVA_REGSPACE_IOBAR:
    ppVar18 = regspace->card->iobar;
    if (ppVar18 == (pci_io_handle *)0x0) {
      return 3;
    }
    iVar11 = regspace->regsz;
    if (regspace->card->iobarlen - (long)iVar11 < (ulong)addr) {
      return 1;
    }
    if (iVar11 == 4) {
LAB_001042bb:
      uVar15 = pci_io_read32(ppVar18);
      uVar13 = (ulong)uVar15;
    }
    else {
      if (iVar11 != 2) goto joined_r0x00103e53;
LAB_001042ae:
      uVar10 = pci_io_read16(ppVar18);
      uVar13 = (ulong)uVar10;
    }
    break;
  case NVA_REGSPACE_RAWMEM:
    ppvVar12 = &regspace->card->rawmem;
    sVar16 = 0x100000;
LAB_00103ccb:
    pvVar14 = *ppvVar12;
    if (pvVar14 == (void *)0x0) {
      return 4;
    }
    uVar13 = (ulong)addr;
    if (sVar16 - (long)regspace->regsz < uVar13) {
      return 1;
    }
    iVar11 = 2;
    switch(regspace->regsz) {
    case 1:
      uVar13 = (ulong)*(byte *)((long)pvVar14 + uVar13);
      break;
    case 2:
      uVar13 = (ulong)*(ushort *)((long)pvVar14 + uVar13);
      break;
    default:
      goto switchD_00103d08_caseD_3;
    case 4:
      uVar13 = (ulong)*(uint *)((long)pvVar14 + uVar13);
      break;
    case 8:
      uVar13 = *(ulong *)((long)pvVar14 + uVar13);
    }
    break;
  case NVA_REGSPACE_RAWIO:
    ppVar18 = regspace->card->rawio;
    if (ppVar18 == (pci_io_handle *)0x0) {
      return 3;
    }
    iVar11 = regspace->regsz;
    if (0x10000U - iVar11 < addr) {
      return 1;
    }
    if (iVar11 == 4) goto LAB_001042bb;
    if (iVar11 == 2) goto LAB_001042ae;
joined_r0x00103e53:
    if (iVar11 != 1) {
      return 2;
    }
    bVar9 = pci_io_read8(ppVar18);
    uVar13 = (ulong)bVar9;
    break;
  case NVA_REGSPACE_PDAC:
    if ((regspace->card->chipset).chipset != 1) {
      return 3;
    }
    if (0x10000U - regspace->regsz < addr) {
      return 1;
    }
    if (8 < regspace->regsz) {
      return 2;
    }
    *(uint32_t *)((long)nva_cards[regspace->cnum]->bar0 + 0x609010) = addr & 0xff;
    *(uint32_t *)((long)ppnVar8[regspace->cnum]->bar0 + 0x609014) = addr >> 8;
    *val = 0;
    if (0 < (long)regspace->regsz) {
      uVar19 = *val;
      lVar17 = 0;
      do {
        uVar19 = uVar19 | (ulong)(*(uint *)((long)ppnVar8[regspace->cnum]->bar0 + 0x609018) & 0xff)
                          << ((byte)lVar17 & 0x3f);
        lVar17 = lVar17 + 8;
      } while ((long)regspace->regsz * 8 != lVar17);
      *val = uVar19;
    }
    goto LAB_001042c8;
  case NVA_REGSPACE_EEPROM:
    if ((regspace->card->chipset).chipset != 1) {
      return 3;
    }
    if (regspace->regsz != 1) {
      return 2;
    }
    if (0x7f < addr) {
      return 1;
    }
    do {
    } while ((*(uint *)((long)nva_cards[regspace->cnum]->bar0 + 0x60a400) >> 0x1c & 1) != 0);
    *(uint32_t *)((long)nva_cards[regspace->cnum]->bar0 + 0x60a400) = addr << 8 | 0x2000000;
    do {
    } while ((*(uint *)((long)ppnVar8[regspace->cnum]->bar0 + 0x60a400) >> 0x1c & 1) != 0);
    uVar13 = (ulong)(*(uint *)((long)ppnVar8[regspace->cnum]->bar0 + 0x60a400) & 0xff);
    break;
  case NVA_REGSPACE_VGA_CR:
    if (0xff < addr) {
      return 1;
    }
    iVar11 = 0x3d4;
    bVar6 = false;
    goto LAB_0010400e;
  case NVA_REGSPACE_VGA_SR:
    if (7 < addr) {
      return 1;
    }
    iVar11 = 0x3c4;
    bVar6 = true;
LAB_0010400e:
    bVar5 = false;
LAB_00104011:
    bVar7 = false;
LAB_00104013:
    if (regspace->regsz != 1) {
      return 2;
    }
    iVar20 = (regspace->card->chipset).card_type;
    if (iVar20 == 1) {
      if (regspace->idx != 0) {
        return 3;
      }
      iVar20 = 0x6d0000;
    }
    else if (iVar20 < 0x50) {
      iVar20 = 0x601000;
      if (bVar5) {
        iVar20 = 0xc0000;
      }
      if (bVar6) {
        iVar20 = 0xc0000;
      }
      iVar3 = regspace->idx;
      if (2 < iVar3) {
switchD_00103d08_caseD_3:
        return 3;
      }
      iVar4 = (regspace->card->chipset).chipset;
      if ((((iVar4 < 0x17) || (iVar4 == 0x20)) || (iVar4 == 0x1a)) && (iVar3 == 1)) {
        return 3;
      }
      iVar20 = iVar3 * 0x2000 + iVar20;
    }
    else {
      if (regspace->idx != 0) {
        return 3;
      }
      iVar20 = 0x601000;
    }
    pvVar14 = nva_cards[regspace->cnum]->bar0;
    if (bVar7) {
      uVar13 = (ulong)(iVar20 + 0x3c0);
      uVar21 = *(undefined1 *)((long)pvVar14 + uVar13);
      *(char *)((long)pvVar14 + uVar13) = (char)addr;
      pvVar14 = nva_cards[regspace->cnum]->bar0;
      *val = (ulong)*(byte *)((long)pvVar14 + (ulong)(iVar20 + 0x3c1));
    }
    else {
      uVar13 = (ulong)(uint)(iVar20 + iVar11);
      uVar21 = *(undefined1 *)((long)pvVar14 + uVar13);
      *(char *)((long)pvVar14 + uVar13) = (char)addr;
      pvVar14 = nva_cards[regspace->cnum]->bar0;
      *val = (ulong)*(byte *)((long)pvVar14 + (ulong)(iVar11 + iVar20 + 1));
    }
    *(undefined1 *)((long)pvVar14 + uVar13) = uVar21;
    goto LAB_001042c8;
  case NVA_REGSPACE_VGA_AR:
    if (0x1f < addr) {
      return 1;
    }
    iVar11 = 0x3c0;
    bVar7 = true;
    bVar6 = false;
    bVar5 = false;
    goto LAB_00104013;
  case NVA_REGSPACE_VGA_GR:
    if (0xf < addr) {
      return 1;
    }
    iVar11 = 0x3ce;
    bVar5 = true;
    bVar6 = false;
    goto LAB_00104011;
  case NVA_REGSPACE_VGA_ST:
    if ((regspace->card->chipset).chipset < 0x41) {
      return 3;
    }
    if (regspace->regsz != 1) {
      return 2;
    }
    lVar17 = 0x1380;
    if (0x4f < (regspace->card->chipset).card_type) {
      lVar17 = 0x619e40;
    }
    pvVar14 = nva_cards[regspace->cnum]->bar0;
    uVar1 = *(undefined4 *)((long)pvVar14 + lVar17 + 0xc);
    uVar2 = *(undefined4 *)((long)pvVar14 + lVar17 + 8);
    *(uint32_t *)((long)pvVar14 + lVar17 + 0xc) = addr + 1;
    *(undefined4 *)((long)ppnVar8[regspace->cnum]->bar0 + lVar17 + 8) = 7;
    pvVar14 = ppnVar8[regspace->cnum]->bar0;
    *val = (ulong)*(uint *)((long)pvVar14 + lVar17);
    *(undefined4 *)((long)pvVar14 + lVar17 + 8) = uVar2;
    *(undefined4 *)((long)ppnVar8[regspace->cnum]->bar0 + lVar17 + 0xc) = uVar1;
    goto LAB_001042c8;
  case NVA_REGSPACE_DPRAM:
    if ((regspace->card->chipset).chipset == 0x34) {
      if (regspace->regsz != 4) {
        return 2;
      }
      *(uint32_t *)((long)nva_cards[regspace->cnum]->bar0 + 0x400bb0) = addr;
      uVar13 = (ulong)*(uint *)((long)ppnVar8[regspace->cnum]->bar0 + 0x400bb4);
    }
    else {
      if ((regspace->card->chipset).card_type - 0x20U < 0xffffffe4) {
        return 3;
      }
      if (regspace->regsz != 4) {
        return 2;
      }
      *(uint32_t *)((long)nva_cards[regspace->cnum]->bar0 + 0x400828) = addr;
      uVar13 = (ulong)*(uint *)((long)ppnVar8[regspace->cnum]->bar0 + 0x40082c);
    }
    break;
  case NVA_REGSPACE_PIPE:
    if ((regspace->card->chipset).card_type - 0x50U < 0xffffffc0) {
      return 3;
    }
    if (regspace->regsz != 4) {
      return 2;
    }
    *(uint32_t *)((long)nva_cards[regspace->cnum]->bar0 + 0x400f50) = addr;
    uVar13 = (ulong)*(uint *)((long)ppnVar8[regspace->cnum]->bar0 + 0x400f54);
    break;
  case NVA_REGSPACE_RDI:
    uVar15 = (regspace->card->chipset).chipset;
    if ((uVar15 < 0x20) && ((0x81800000U >> (uVar15 & 0x1f) & 1) != 0)) {
      if (regspace->regsz != 4) {
        return 2;
      }
      *(uint32_t *)((long)nva_cards[regspace->cnum]->bar0 + 0x400a08) = addr;
      uVar13 = (ulong)*(uint *)((long)ppnVar8[regspace->cnum]->bar0 + 0x400a0c);
    }
    else {
      if ((regspace->card->chipset).card_type - 0x50U < 0xffffffd0) {
        return 3;
      }
      if (regspace->regsz != 4) {
        return 2;
      }
      *(uint32_t *)((long)nva_cards[regspace->cnum]->bar0 + 0x400750) = addr;
      uVar13 = (ulong)*(uint *)((long)ppnVar8[regspace->cnum]->bar0 + 0x400754);
    }
    break;
  case NVA_REGSPACE_RDIB:
    if ((regspace->card->chipset).card_type - 0x50U < 0xffffffd0) {
      return 3;
    }
    if (regspace->regsz != 4) {
      return 2;
    }
    *(uint32_t *)((long)nva_cards[regspace->cnum]->bar0 + 0x400750) = addr;
    uVar13 = (ulong)*(uint *)((long)ppnVar8[regspace->cnum]->bar0 + 0x400758);
    break;
  case NVA_REGSPACE_VCOMP_CODE:
    if ((regspace->card->chipset).chipset != 0xaf) {
      return 3;
    }
    if (regspace->regsz != 4) {
      return 2;
    }
    *(uint32_t *)((long)nva_cards[regspace->cnum]->bar0 + 0x1c17c8) = addr;
    uVar13 = (ulong)*(uint *)((long)ppnVar8[regspace->cnum]->bar0 + 0x1c17cc);
    break;
  case NVA_REGSPACE_VCOMP_REG:
    if ((regspace->card->chipset).chipset != 0xaf) {
      return 3;
    }
    if (regspace->regsz != 8) {
      return 2;
    }
    *(uint32_t *)((long)nva_cards[regspace->cnum]->bar0 + 0x1c17d0) = addr >> 3;
    pvVar14 = ppnVar8[regspace->cnum]->bar0;
    uVar15 = *(uint *)((long)pvVar14 + 0x1c17d4);
    *val = (ulong)uVar15;
    uVar13 = CONCAT44(*(undefined4 *)((long)pvVar14 + 0x1c17d8),uVar15);
    break;
  case NVA_REGSPACE_MACRO_CODE:
    if ((regspace->card->chipset).chipset < 0xc0) {
      return 3;
    }
    if (regspace->regsz != 4) {
      return 2;
    }
    *(undefined4 *)((long)nva_cards[regspace->cnum]->bar0 + 0x40986c) = 0x10;
    *(undefined4 *)((long)ppnVar8[regspace->cnum]->bar0 + 0x409ffc) = 2;
    *(undefined4 *)((long)ppnVar8[regspace->cnum]->bar0 + 0x409928) = 0xc;
    do {
    } while (*(int *)((long)ppnVar8[regspace->cnum]->bar0 + 0x409928) != 0);
    *(undefined4 *)((long)ppnVar8[regspace->cnum]->bar0 + 0x40993c) = 0xf;
    *(undefined4 *)((long)ppnVar8[regspace->cnum]->bar0 + 0x409928) = 10;
    do {
    } while (*(int *)((long)ppnVar8[regspace->cnum]->bar0 + 0x409928) != 0);
    *(undefined4 *)((long)ppnVar8[regspace->cnum]->bar0 + 0x40991c) = 1;
    *(undefined4 *)((long)ppnVar8[regspace->cnum]->bar0 + 0x409928) = 1;
    do {
    } while (*(int *)((long)ppnVar8[regspace->cnum]->bar0 + 0x409928) != 0);
    if (addr != 0) {
      uVar15 = 0;
      do {
        *(undefined4 *)((long)ppnVar8[regspace->cnum]->bar0 + 0x409928) = 6;
        do {
        } while (*(int *)((long)ppnVar8[regspace->cnum]->bar0 + 0x409928) != 0);
        uVar15 = uVar15 + 4;
      } while (uVar15 < addr);
    }
    *(undefined4 *)((long)ppnVar8[regspace->cnum]->bar0 + 0x409928) = 6;
    do {
    } while (*(int *)((long)ppnVar8[regspace->cnum]->bar0 + 0x409928) != 0);
    uVar13 = (ulong)*(uint *)((long)ppnVar8[regspace->cnum]->bar0 + 0x409918);
    break;
  case NVA_REGSPACE_XT:
    if (regspace->regsz != 4) {
      return 2;
    }
    *(undefined4 *)((long)nva_cards[regspace->cnum]->bar0 + 0x1700) = 0x30;
    *(uint32_t *)((long)ppnVar8[regspace->cnum]->bar0 + 0x700004) = addr;
    *(undefined4 *)((long)ppnVar8[regspace->cnum]->bar0 + 0x70000) = 1;
    do {
    } while (*(int *)((long)ppnVar8[regspace->cnum]->bar0 + 0x70000) != 0);
    *(undefined4 *)((long)ppnVar8[regspace->cnum]->bar0 + 0x700000) = 1;
    do {
    } while (*(int *)((long)ppnVar8[regspace->cnum]->bar0 + 0x700000) != 0);
    uVar13 = (ulong)*(uint *)((long)ppnVar8[regspace->cnum]->bar0 + 0x700004);
    break;
  default:
    goto switchD_00103d08_caseD_3;
  }
  *val = uVar13;
LAB_001042c8:
  iVar11 = 0;
switchD_00103d08_caseD_3:
  return iVar11;
}

Assistant:

int nva_rd(struct nva_regspace *regspace, uint32_t addr, uint64_t *val) {
	void *rawbase = 0;
	size_t rawlen;
	void *raw;
	int i;
	uint32_t vgaio;
	uint32_t vgabase;
	switch (regspace->type) {
		case NVA_REGSPACE_BAR0:
			rawbase = regspace->card->bar0;
			rawlen = regspace->card->bar0len;
			goto raw;
		case NVA_REGSPACE_BAR1:
			rawbase = regspace->card->bar1;
			rawlen = regspace->card->bar1len;
			goto raw;
		case NVA_REGSPACE_BAR2:
			rawbase = regspace->card->bar2;
			rawlen = regspace->card->bar2len;
			goto raw;
		case NVA_REGSPACE_RAWMEM:
			rawbase = regspace->card->rawmem;
			rawlen = 0x100000;
		raw:
			if (!rawbase)
				return NVA_ERR_MAP;
			if (addr > rawlen - regspace->regsz)
				return NVA_ERR_RANGE;
			raw = (uint8_t *)rawbase + addr;
			switch (regspace->regsz) {
				case 1:
					*val = *(volatile uint8_t *)raw;
					return 0;
				case 2:
					*val = *(volatile uint16_t *)raw;
					return 0;
				case 4:
					*val = *(volatile uint32_t *)raw;
					return 0;
				case 8:
					*val = *(volatile uint64_t *)raw;
					return 0;
				default:
					return NVA_ERR_REGSZ;
			}
		case NVA_REGSPACE_IOBAR:
			if (!regspace->card->iobar)
				return NVA_ERR_NOSPC;
			if (addr > regspace->card->iobarlen - regspace->regsz)
				return NVA_ERR_RANGE;
			switch (regspace->regsz) {
				case 1:
					*val = pci_io_read8(regspace->card->iobar, addr);
					return 0;
				case 2:
					*val = pci_io_read16(regspace->card->iobar, addr);
					return 0;
				case 4:
					*val = pci_io_read32(regspace->card->iobar, addr);
					return 0;
				default:
					return NVA_ERR_REGSZ;
			}
		case NVA_REGSPACE_RAWIO:
			if (!regspace->card->rawio)
				return NVA_ERR_NOSPC;
			if (addr > 0x10000 - regspace->regsz)
				return NVA_ERR_RANGE;
			switch (regspace->regsz) {
				case 1:
					*val = pci_io_read8(regspace->card->rawio, addr);
					return 0;
				case 2:
					*val = pci_io_read16(regspace->card->rawio, addr);
					return 0;
				case 4:
					*val = pci_io_read32(regspace->card->rawio, addr);
					return 0;
				default:
					return NVA_ERR_REGSZ;
			}
		case NVA_REGSPACE_PDAC:
			if (regspace->card->chipset.chipset != 0x01)
				return NVA_ERR_NOSPC;
			if (addr > 0x10000 - regspace->regsz)
				return NVA_ERR_RANGE;
			if (regspace->regsz > 8)
				return NVA_ERR_REGSZ;
			nva_wr32(regspace->cnum, 0x609010, addr & 0xff);
			nva_wr32(regspace->cnum, 0x609014, addr >> 8);
			*val = 0;
			for (i = 0; i < regspace->regsz; i++)
				*val |= (uint64_t)(nva_rd32(regspace->cnum, 0x609018) & 0xff) << i * 8;
			return 0;
		case NVA_REGSPACE_EEPROM:
			if (regspace->card->chipset.chipset != 0x01)
				return NVA_ERR_NOSPC;
			if (regspace->regsz != 1)
				return NVA_ERR_REGSZ;
			if (addr >= 0x80)
				return NVA_ERR_RANGE;
			while (nva_rd32(regspace->cnum, 0x60a400) & 0x10000000);
			nva_wr32(regspace->cnum, 0x60a400, 0x2000000 | addr << 8);
			while (nva_rd32(regspace->cnum, 0x60a400) & 0x10000000);
			*val = nva_rd32(regspace->cnum, 0x60a400) & 0xff;
			return 0;
		case NVA_REGSPACE_VGA_CR:
			vgaio = 0x3d4;
			if (addr >= 0x100)
				return NVA_ERR_RANGE;
			goto vga;
		case NVA_REGSPACE_VGA_SR:
			vgaio = 0x3c4;
			if (addr >= 8)
				return NVA_ERR_RANGE;
			goto vga;
		case NVA_REGSPACE_VGA_GR:
			vgaio = 0x3ce;
			if (addr >= 0x10)
				return NVA_ERR_RANGE;
			goto vga;
		case NVA_REGSPACE_VGA_AR:
			vgaio = 0x3c0;
			if (addr >= 0x20)
				return NVA_ERR_RANGE;
			goto vga;
		vga:
			if (regspace->regsz != 1)
				return NVA_ERR_REGSZ;
			if (regspace->card->chipset.card_type == 0x01) {
				vgabase = 0x6d0000;
				if (regspace->idx != 0)
					return NVA_ERR_NOSPC;
			} else if (regspace->card->chipset.card_type < 0x50) {
				if (vgaio == 0x3c4 || vgaio == 0x3ce)
					vgabase = 0x0c0000;
				else
					vgabase = 0x601000;
				if (regspace->idx > 2)
					return NVA_ERR_NOSPC;
				if ((regspace->card->chipset.chipset < 0x17 || regspace->card->chipset.chipset == 0x1a || regspace->card->chipset.chipset == 0x20) && regspace->idx == 1)
					return NVA_ERR_NOSPC;
				vgabase += regspace->idx * 0x2000;
			} else {
				vgabase = 0x601000;
				if (regspace->idx != 0)
					return NVA_ERR_NOSPC;
			}
			if (vgaio == 0x3c0) {
				nva_rd8(regspace->cnum, vgabase + 0x3da);
				uint8_t idx = nva_rd8(regspace->cnum, vgabase + 0x3c0);
				nva_rd8(regspace->cnum, vgabase + 0x3da);
				nva_wr8(regspace->cnum, vgabase + 0x3c0, addr);
				*val = nva_rd8(regspace->cnum, vgabase + 0x3c1);
				nva_rd8(regspace->cnum, vgabase + 0x3da);
				nva_wr8(regspace->cnum, vgabase + 0x3c0, idx);
			} else {
				uint8_t idx = nva_rd8(regspace->cnum, vgabase + vgaio);
				nva_wr8(regspace->cnum, vgabase + vgaio, addr);
				*val = nva_rd8(regspace->cnum, vgabase + vgaio + 1);
				nva_wr8(regspace->cnum, vgabase + vgaio, idx);
			}
			return 0;
		case NVA_REGSPACE_VGA_ST:
			if (regspace->card->chipset.chipset < 0x41)
				return NVA_ERR_NOSPC;
			if (regspace->regsz != 1)
				return NVA_ERR_REGSZ;
			uint32_t vstbase = 0x1380;
			if (regspace->card->chipset.card_type >= 0x50)
				vstbase = 0x619e40;
			uint32_t savepos = nva_rd32(regspace->cnum, vstbase+0xc);
			uint32_t savecfg = nva_rd32(regspace->cnum, vstbase+0x8);
			nva_wr32(regspace->cnum, vstbase+0xc, addr+1);
			nva_wr32(regspace->cnum, vstbase+0x8, 7);
			*val = nva_rd32(regspace->cnum, vstbase+0x0);
			nva_wr32(regspace->cnum, vstbase+0x8, savecfg);
			nva_wr32(regspace->cnum, vstbase+0xc, savepos);
			return 0;
		case NVA_REGSPACE_DPRAM:
			if (regspace->card->chipset.chipset == 0x34) {
				if (regspace->regsz != 4)
					return NVA_ERR_REGSZ;
				nva_wr32(regspace->cnum, 0x400bb0, addr);
				*val = nva_rd32(regspace->cnum, 0x400bb4);
				return 0;
			}
			if (regspace->card->chipset.card_type < 4 || regspace->card->chipset.card_type >= 0x20)
				return NVA_ERR_NOSPC;
			if (regspace->regsz != 4)
				return NVA_ERR_REGSZ;
			nva_wr32(regspace->cnum, 0x400828, addr);
			*val = nva_rd32(regspace->cnum, 0x40082c);
			return 0;
		case NVA_REGSPACE_PIPE:
			if (regspace->card->chipset.card_type < 0x10 || regspace->card->chipset.card_type >= 0x50)
				return NVA_ERR_NOSPC;
			if (regspace->regsz != 4)
				return NVA_ERR_REGSZ;
			nva_wr32(regspace->cnum, 0x400f50, addr);
			*val = nva_rd32(regspace->cnum, 0x400f54);
			return 0;
		case NVA_REGSPACE_RDI:
			if (regspace->card->chipset.chipset == 0x17 || regspace->card->chipset.chipset == 0x18 || regspace->card->chipset.chipset == 0x1f) {
				if (regspace->regsz != 4)
					return NVA_ERR_REGSZ;
				nva_wr32(regspace->cnum, 0x400a08, addr);
				*val = nva_rd32(regspace->cnum, 0x400a0c);
				return 0;
			}
			if (regspace->card->chipset.card_type < 0x20 || regspace->card->chipset.card_type >= 0x50)
				return NVA_ERR_NOSPC;
			if (regspace->regsz != 4)
				return NVA_ERR_REGSZ;
			nva_wr32(regspace->cnum, 0x400750, addr);
			*val = nva_rd32(regspace->cnum, 0x400754);
			return 0;
		case NVA_REGSPACE_RDIB:
			if (regspace->card->chipset.card_type < 0x20 || regspace->card->chipset.card_type >= 0x50)
				return NVA_ERR_NOSPC;
			if (regspace->regsz != 4)
				return NVA_ERR_REGSZ;
			nva_wr32(regspace->cnum, 0x400750, addr);
			*val = nva_rd32(regspace->cnum, 0x400758);
			return 0;
		case NVA_REGSPACE_VCOMP_CODE:
			if (regspace->card->chipset.chipset != 0xaf)
				return NVA_ERR_NOSPC;
			if (regspace->regsz != 4)
				return NVA_ERR_REGSZ;
			nva_wr32(regspace->cnum, 0x1c17c8, addr);
			*val = nva_rd32(regspace->cnum, 0x1c17cc);
			return 0;
		case NVA_REGSPACE_VCOMP_REG:
			if (regspace->card->chipset.chipset != 0xaf)
				return NVA_ERR_NOSPC;
			if (regspace->regsz != 8)
				return NVA_ERR_REGSZ;
			nva_wr32(regspace->cnum, 0x1c17d0, addr/8);
			*val = nva_rd32(regspace->cnum, 0x1c17d4);
			*val |= (uint64_t)nva_rd32(regspace->cnum, 0x1c17d8) << 32;
			return 0;
		case NVA_REGSPACE_MACRO_CODE:
			if (regspace->card->chipset.chipset < 0xc0)
				return NVA_ERR_NOSPC;
			if (regspace->regsz != 4)
				return NVA_ERR_REGSZ;
			nva_wr32(regspace->cnum, 0x40986c, 0x10);
			nva_wr32(regspace->cnum, 0x409ffc, 2);
			nva_wr32(regspace->cnum, 0x409928, 0xc);
			while (nva_rd32(regspace->cnum, 0x409928));
			nva_wr32(regspace->cnum, 0x40993c, 0xf);
			nva_wr32(regspace->cnum, 0x409928, 0xa);
			while (nva_rd32(regspace->cnum, 0x409928));
			nva_wr32(regspace->cnum, 0x40991c, 0x1);
			nva_wr32(regspace->cnum, 0x409928, 0x1);
			while (nva_rd32(regspace->cnum, 0x409928));
			for (i = 0; i < addr; i+=4) {
				nva_wr32(regspace->cnum, 0x409928, 0x6);
				while (nva_rd32(regspace->cnum, 0x409928));
			}
			nva_wr32(regspace->cnum, 0x409928, 0x6);
			while (nva_rd32(regspace->cnum, 0x409928));
			*val = nva_rd32(regspace->cnum, 0x409918);
			return 0;
		case NVA_REGSPACE_XT:
			if (regspace->regsz != 4)
				return NVA_ERR_REGSZ;
			nva_wr32(regspace->cnum, 0x1700, 0x30);
			nva_wr32(regspace->cnum, 0x700004, addr);
			nva_wr32(regspace->cnum, 0x70000, 1);
			while (nva_rd32(regspace->cnum, 0x70000));
			nva_wr32(regspace->cnum, 0x700000, 1);
			while (nva_rd32(regspace->cnum, 0x700000));
			*val = nva_rd32(regspace->cnum, 0x700004);
			return 0;
		default:
			return NVA_ERR_NOSPC;
	}
}